

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O2

unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
 __thiscall
Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::popForRead
          (Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *this)

{
  __pthread_internal_list **this_00;
  long *plVar1;
  size_type sVar2;
  mutex_type *in_RSI;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> uStack_38;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_38,in_RSI);
  this_00 = &in_RSI[4].super___mutex_base._M_mutex.__data.__list.__next;
  while( true ) {
    sVar2 = std::
            deque<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>,_std::allocator<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>_>_>
            ::size((deque<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>,_std::allocator<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>_>_>
                    *)this_00);
    if ((sVar2 != 0) || (in_RSI[2].super___mutex_base._M_mutex.__size[0x18] != '\0')) break;
    std::condition_variable::wait((unique_lock *)(in_RSI + 1));
  }
  sVar2 = std::
          deque<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>,_std::allocator<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>_>_>
          ::size((deque<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>,_std::allocator<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>_>_>
                  *)this_00);
  if ((sVar2 == 0) && (in_RSI[2].super___mutex_base._M_mutex.__size[0x18] == '\x01')) {
    (this->m_).super___mutex_base._M_mutex.__align = 0;
  }
  else {
    plVar1 = *(long **)((long)&in_RSI[5].super___mutex_base._M_mutex + 8);
    (this->m_).super___mutex_base._M_mutex.__align = *plVar1;
    *plVar1 = 0;
    std::
    deque<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>,_std::allocator<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>_>_>
    ::pop_front((deque<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>,_std::allocator<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>_>_>
                 *)this_00);
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_38);
  return (__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> popForRead() {
    std::unique_lock<std::mutex> lock(m_);
    while (read_.size() == 0 && !closed_) {
      cv_.wait(lock);
    }

    // Allow read side to drain
    if (read_.size() == 0 && closed_) {
      return std::unique_ptr<T>(nullptr);
    }

    auto v = std::move(read_.front());
    read_.pop_front();
    return v;
  }